

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

void Llb_Nonlin4RecordState
               (Aig_Man_t *pAig,Vec_Int_t *vOrder,uint *pState,char *pValues,int fBackward)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_68;
  int local_44;
  int i;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  int fBackward_local;
  char *pValues_local;
  uint *pState_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  
  for (local_44 = 0; iVar1 = Saig_ManRegNum(pAig), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar2 = Saig_ManLi(pAig,local_44);
    local_68 = Saig_ManLo(pAig,local_44);
    if (fBackward != 0) {
      local_68 = pAVar2;
    }
    iVar1 = Llb_ObjBddVar(vOrder,local_68);
    if (pValues[iVar1] == '\x01') {
      Abc_InfoSetBit(pState,local_44);
    }
  }
  return;
}

Assistant:

void Llb_Nonlin4RecordState( Aig_Man_t * pAig, Vec_Int_t * vOrder, unsigned * pState, char * pValues, int fBackward )
{
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
        if ( pValues[Llb_ObjBddVar(vOrder, fBackward? pObjLi : pObjLo)] == 1 )
            Abc_InfoSetBit( pState, i );
}